

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_container_is_subset_bitset(run_container_t *container1,bitset_container_t *container2)

{
  ushort uVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint local_34;
  uint32_t j;
  uint32_t le;
  uint32_t run_start;
  int i;
  int32_t card;
  bitset_container_t *container2_local;
  run_container_t *container1_local;
  
  if (container2->cardinality == -1) {
    iVar4 = bitset_container_compute_cardinality(container2);
    iVar3 = run_container_cardinality(container1);
    if (iVar4 < iVar3) {
      return false;
    }
  }
  else {
    iVar4 = container2->cardinality;
    iVar3 = run_container_cardinality(container1);
    if (iVar4 < iVar3) {
      return false;
    }
  }
  le = 0;
  do {
    if (container1->n_runs <= (int)le) {
      return true;
    }
    uVar1 = container1->runs[(int)le].length;
    uVar5 = (uint)container1->runs[(int)le].value;
    for (local_34 = uVar5; local_34 <= uVar5 + uVar1; local_34 = local_34 + 1) {
      _Var2 = bitset_container_contains(container2,(uint16_t)local_34);
      if (!_Var2) {
        return false;
      }
    }
    le = le + 1;
  } while( true );
}

Assistant:

bool run_container_is_subset_bitset(const run_container_t* container1,
                                    const bitset_container_t* container2) {
    // todo: this code could be much faster
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality < run_container_cardinality(container1)) {
            return false;
        }
    } else {
        int32_t card = bitset_container_compute_cardinality(
            container2);  // modify container2?
        if (card < run_container_cardinality(container1)) {
            return false;
        }
    }
    for (int i = 0; i < container1->n_runs; ++i) {
        uint32_t run_start = container1->runs[i].value;
        uint32_t le = container1->runs[i].length;
        for (uint32_t j = run_start; j <= run_start + le; ++j) {
            if (!bitset_container_contains(container2, j)) {
                return false;
            }
        }
    }
    return true;
}